

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O1

Error * ot::commissioner::CommissionerImpl::DecodeBbrDataset
                  (Error *__return_storage_ptr__,BbrDataset *aDataset,Response *aResponse)

{
  string *this;
  ErrorCode EVar1;
  Tlv *pTVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  pointer pcVar4;
  bool bVar5;
  BbrDataset *pBVar6;
  mapped_type *pmVar7;
  ByteArray *aRawAddr;
  Address addr;
  BbrDataset dataset;
  TlvSet tlvSet;
  undefined1 local_118 [8];
  _Alloc_hider local_110;
  undefined1 local_108 [8];
  char local_100 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f0;
  Address local_e8;
  BbrDataset *local_d0;
  undefined1 *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [16];
  undefined1 *local_a8;
  undefined8 local_a0;
  undefined1 local_98 [16];
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  uint16_t local_68;
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  local_60;
  
  __return_storage_ptr__->mCode = kNone;
  this = &__return_storage_ptr__->mMessage;
  local_f0 = &(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)local_f0;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c8 = local_b8;
  local_c0 = 0;
  local_b8[0] = 0;
  local_a0 = 0;
  local_98[0] = 0;
  local_80 = 0;
  local_78[0] = 0;
  local_68 = 0;
  local_d0 = aDataset;
  local_a8 = local_98;
  local_88 = local_78;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  tlv::GetTlvSet((Error *)local_118,(TlvSet *)&local_60,&aResponse->mPayload,kMeshCoP);
  __return_storage_ptr__->mCode = local_118._0_4_;
  std::__cxx11::string::operator=((string *)this,(string *)&local_110);
  EVar1 = __return_storage_ptr__->mCode;
  if (local_110._M_p != local_100) {
    operator_delete(local_110._M_p);
  }
  if (EVar1 != kNone) goto LAB_001a4eda;
  local_118[0] = 0x43;
  pmVar7 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&local_60,local_118);
  pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  if (pTVar2 != (Tlv *)0x0) {
    tlv::Tlv::GetValueAsString_abi_cxx11_((string *)local_118,pTVar2);
    std::__cxx11::string::operator=((string *)&local_c8,(string *)local_118);
    if ((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_) != local_108) {
      operator_delete((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_));
    }
    local_68 = local_68 | 0x8000;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_118[0] = 0x45;
  pmVar7 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&local_60,local_118);
  pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  if (pTVar2 != (Tlv *)0x0) {
    tlv::Tlv::GetValueAsString_abi_cxx11_((string *)local_118,pTVar2);
    std::__cxx11::string::operator=((string *)&local_a8,(string *)local_118);
    if ((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_) != local_108) {
      operator_delete((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_));
    }
    local_68 = local_68 | 0x4000;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  local_118[0] = 0x44;
  pmVar7 = std::
           map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
           ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         *)&local_60,local_118);
  pTVar2 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var3 = (pmVar7->super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  if (pTVar2 == (Tlv *)0x0) {
LAB_001a513b:
    bVar5 = false;
  }
  else {
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    aRawAddr = tlv::Tlv::GetValue(pTVar2);
    Address::Set((Error *)local_118,&local_e8,aRawAddr);
    __return_storage_ptr__->mCode = local_118._0_4_;
    std::__cxx11::string::operator=((string *)this,(string *)&local_110);
    EVar1 = __return_storage_ptr__->mCode;
    if (local_110._M_p != local_100) {
      operator_delete(local_110._M_p);
    }
    bVar5 = true;
    if (EVar1 == kNone) {
      Address::ToString_abi_cxx11_((string *)local_118,&local_e8);
      std::__cxx11::string::operator=((string *)&local_88,(string *)local_118);
      if ((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_) != local_108) {
        operator_delete((undefined1 *)CONCAT44(local_118._4_4_,local_118._0_4_));
      }
      local_68 = local_68 | 0x2000;
      bVar5 = false;
    }
    if (local_e8.mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_e8.mBytes.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (EVar1 == kNone) goto LAB_001a513b;
  }
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
  }
  pBVar6 = local_d0;
  if (!bVar5) {
    if (bVar5) {
      if (local_88 != local_78) {
        operator_delete(local_88);
      }
      if (local_a8 != local_98) {
        operator_delete(local_a8);
      }
      if (local_c8 != local_b8) {
        operator_delete(local_c8);
      }
      std::
      _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
      ::~_Rb_tree(&local_60);
      pcVar4 = (this->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar4 == local_f0) {
        return __return_storage_ptr__;
      }
      operator_delete(pcVar4);
      return __return_storage_ptr__;
    }
    std::__cxx11::string::_M_assign((string *)local_d0);
    std::__cxx11::string::_M_assign((string *)&pBVar6->mRegistrarHostname);
    std::__cxx11::string::_M_assign((string *)&pBVar6->mRegistrarIpv6Addr);
    pBVar6->mPresentFlags = local_68;
  }
LAB_001a4eda:
  if (local_88 != local_78) {
    operator_delete(local_88);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  std::
  _Rb_tree<ot::commissioner::tlv::Type,_std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>,_std::_Select1st<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~_Rb_tree(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerImpl::DecodeBbrDataset(BbrDataset &aDataset, const coap::Response &aResponse)
{
    Error       error;
    tlv::TlvSet tlvSet;
    BbrDataset  dataset;

    SuccessOrExit(error = GetTlvSet(tlvSet, aResponse));

    if (auto triHostname = tlvSet[tlv::Type::kTriHostname])
    {
        dataset.mTriHostname = triHostname->GetValueAsString();
        dataset.mPresentFlags |= BbrDataset::kTriHostnameBit;
    }

    if (auto registrarHostname = tlvSet[tlv::Type::kRegistrarHostname])
    {
        dataset.mRegistrarHostname = registrarHostname->GetValueAsString();
        dataset.mPresentFlags |= BbrDataset::kRegistrarHostnameBit;
    }

    if (auto registrarIpv6Addr = tlvSet[tlv::Type::kRegistrarIpv6Address])
    {
        Address addr;

        SuccessOrExit(error = addr.Set(registrarIpv6Addr->GetValue()));

        dataset.mRegistrarIpv6Addr = addr.ToString();
        dataset.mPresentFlags |= BbrDataset::kRegistrarIpv6AddrBit;
    }

    aDataset = dataset;

exit:
    return error;
}